

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O1

U16 __thiscall
ModbusSimulationDataGenerator::update_CRC(ModbusSimulationDataGenerator *this,U16 crc,U8 c)

{
  undefined2 in_register_00000032;
  
  return (ushort)(CONCAT22(in_register_00000032,crc) >> 8) ^
         this->crc_tab16[((uint)c ^ CONCAT22(in_register_00000032,crc)) & 0xff];
}

Assistant:

U16 ModbusSimulationDataGenerator::update_CRC( U16 crc, U8 c )
{
    U16 tmp, short_c;

    short_c = 0x00ff & ( U16 )c;

    // if ( ! crc_tab16_init ) init_crc16_tab();

    tmp = crc ^ short_c;
    crc = ( crc >> 8 ) ^ crc_tab16[ tmp & 0xff ];

    return crc;
}